

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeDebugFunction(Builder *this,Function *function,Id nameId,Id funcTypeId)

{
  uint uVar1;
  Id IVar2;
  mapped_type_conflict *pmVar3;
  Instruction *this_00;
  Id IVar4;
  Id local_34;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  local_34 = funcTypeId;
  if (function == (Function *)0x0) {
    __assert_fail("function != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x945,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
  }
  if (nameId == 0) {
    __assert_fail("nameId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x946,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
  }
  if (funcTypeId == 0) {
    __assert_fail("funcTypeId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x947,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
  }
  pmVar3 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&local_34);
  if (*pmVar3 != 0) {
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    this_00 = (Instruction *)operator_new(0x60);
    IVar2 = makeVoidType(this);
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_0093fd28;
    this_00->resultId = IVar4;
    this_00->typeId = IVar2;
    this_00->opCode = OpExtInst;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_00->block = (Block *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,0xb);
    if ((ulong)(((long)(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage -
                (long)(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) < 0xb) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&this_00->idOperand,0xb);
    }
    Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_00,0x14);
    Instruction::addIdOperand(this_00,nameId);
    pmVar3 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_34);
    Instruction::addIdOperand(this_00,*pmVar3);
    IVar2 = makeDebugSource(this,this->currentFileId);
    Instruction::addIdOperand(this_00,IVar2);
    uVar1 = this->currentLine;
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,uVar1,false);
    Instruction::addIdOperand(this_00,IVar2);
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,0,false);
    Instruction::addIdOperand(this_00,IVar2);
    IVar2 = makeDebugCompilationUnit(this);
    Instruction::addIdOperand(this_00,IVar2);
    Instruction::addIdOperand(this_00,nameId);
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,3,false);
    Instruction::addIdOperand(this_00,IVar2);
    uVar1 = this->currentLine;
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,uVar1,false);
    Instruction::addIdOperand(this_00,IVar2);
    local_30._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
    if (local_30._M_head_impl != (Instruction *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,this_00);
    return IVar4;
  }
  __assert_fail("debugId[funcTypeId] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x948,"Id spv::Builder::makeDebugFunction(Function *, Id, Id)");
}

Assistant:

Id Builder::makeDebugFunction([[maybe_unused]] Function* function, Id nameId, Id funcTypeId)
{
    assert(function != nullptr);
    assert(nameId != 0);
    assert(funcTypeId != 0);
    assert(debugId[funcTypeId] != 0);

    Id funcId = getUniqueId();
    auto type = new Instruction(funcId, makeVoidType(), OpExtInst);
    type->reserveOperands(11);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugFunction);
    type->addIdOperand(nameId);
    type->addIdOperand(debugId[funcTypeId]);
    type->addIdOperand(makeDebugSource(currentFileId)); // TODO: This points to file of definition instead of declaration
    type->addIdOperand(makeUintConstant(currentLine)); // TODO: This points to line of definition instead of declaration
    type->addIdOperand(makeUintConstant(0)); // column
    type->addIdOperand(makeDebugCompilationUnit()); // scope
    type->addIdOperand(nameId); // linkage name
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic));
    type->addIdOperand(makeUintConstant(currentLine)); 
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    return funcId;
}